

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

void __thiscall
slang::ast::ForwardingTypedefSymbol::checkType
          (ForwardingTypedefSymbol *this,ForwardTypedefCategory checkCategory,
          Visibility checkVisibility,SourceLocation declLoc)

{
  Diagnostic *this_00;
  logic_error *this_01;
  char *pcVar1;
  string_view arg;
  size_t sStack_f0;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  while (((this->category == checkCategory || (checkCategory == None)) || (this->category == None)))
  {
    if (((this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::Visibility>._M_engaged == true) &&
       ((this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ast::Visibility>._M_payload._M_value != checkVisibility)
       ) {
      this_00 = Scope::addDiag((this->super_Symbol).parentScope,(DiagCode)0xa0009,
                               (this->super_Symbol).location);
      goto LAB_001c95de;
    }
    this = this->next;
    if (this == (ForwardingTypedefSymbol *)0x0) {
      return;
    }
  }
  this_00 = Scope::addDiag((this->super_Symbol).parentScope,(DiagCode)0x90009,
                           (this->super_Symbol).location);
  switch(this->category) {
  case Enum:
    pcVar1 = "enum";
    sStack_f0 = 4;
    break;
  case Struct:
    pcVar1 = "struct";
    sStack_f0 = 6;
    break;
  case Union:
    pcVar1 = "union";
    goto LAB_001c95c8;
  case Class:
    pcVar1 = "class";
LAB_001c95c8:
    sStack_f0 = 5;
    break;
  case InterfaceClass:
    pcVar1 = "interface class";
    sStack_f0 = 0xf;
    break;
  default:
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/AllTypes.cpp"
               ,&local_e1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_e0,0x482);
    std::operator+(&local_80,&local_a0,&local_e0);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_01,(string *)&local_40);
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  arg._M_str = pcVar1;
  arg._M_len = sStack_f0;
  Diagnostic::operator<<(this_00,arg);
LAB_001c95de:
  Diagnostic::addNote(this_00,(DiagCode)0x40001,declLoc);
  return;
}

Assistant:

void ForwardingTypedefSymbol::checkType(ForwardTypedefCategory checkCategory,
                                        Visibility checkVisibility, SourceLocation declLoc) const {
    if (category != ForwardTypedefCategory::None && checkCategory != ForwardTypedefCategory::None &&
        category != checkCategory) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefDoesNotMatch, location);
        switch (category) {
            case ForwardTypedefCategory::Enum:
                diag << "enum"sv;
                break;
            case ForwardTypedefCategory::Struct:
                diag << "struct"sv;
                break;
            case ForwardTypedefCategory::Union:
                diag << "union"sv;
                break;
            case ForwardTypedefCategory::Class:
                diag << "class"sv;
                break;
            case ForwardTypedefCategory::InterfaceClass:
                diag << "interface class"sv;
                break;
            default:
                ASSUME_UNREACHABLE;
        }
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (visibility && visibility != checkVisibility) {
        auto& diag = getParentScope()->addDiag(diag::ForwardTypedefVisibility, location);
        diag.addNote(diag::NoteDeclarationHere, declLoc);
        return;
    }

    if (next)
        next->checkType(checkCategory, checkVisibility, declLoc);
}